

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayErrorsTest::CheckError
          (GetVertexArrayErrorsTest *this,GLenum expected,GLchar *log_message)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  size_t sVar3;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expected) {
    local_1a0 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    if (log_message == (GLchar *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
    }
    else {
      sVar3 = strlen(log_message);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,log_message,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," ",1);
    local_1b0.m_getName = glu::getErrorName;
    local_1b0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," was observed instead.",0x16);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  return GVar2 == expected;
}

Assistant:

bool GetVertexArrayErrorsTest::CheckError(const glw::GLenum expected, const glw::GLchar* log_message)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLenum error = 0;

	if (expected != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << log_message << " " << glu::getErrorStr(error)
											<< " was observed instead." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}